

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

type * __thiscall
duckdb::Deserializer::
Read<std::map<unsigned_long,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::unique_ptr<duckdb::TableFilter,std::default_delete<duckdb::TableFilter>,true>>>>>
          (type *__return_storage_ptr__,Deserializer *this)

{
  _Rb_tree_header *p_Var1;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar4;
  _Head_base<0UL,_duckdb::TableFilter_*,_false> _Var5;
  long lVar6;
  unsigned_long key;
  key_type local_40;
  TableFilter *local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar3 = (*this->_vptr_Deserializer[8])(this);
  lVar6 = CONCAT44(extraout_var,iVar3);
  if (lVar6 != 0) {
    do {
      (*this->_vptr_Deserializer[6])(this);
      (*this->_vptr_Deserializer[2])(this,0,"key");
      iVar3 = (*this->_vptr_Deserializer[0x15])(this);
      (*this->_vptr_Deserializer[3])(this);
      local_40 = CONCAT44(extraout_var_00,iVar3);
      (*this->_vptr_Deserializer[2])(this,1,"value");
      iVar3 = (*this->_vptr_Deserializer[10])(this);
      if ((char)iVar3 == '\0') {
        _Var5._M_head_impl = (TableFilter *)0x0;
      }
      else {
        (*this->_vptr_Deserializer[6])(this);
        TableFilter::Deserialize((TableFilter *)&local_38,this);
        _Var5._M_head_impl = local_38;
        (*this->_vptr_Deserializer[7])(this);
      }
      (*this->_vptr_Deserializer[0xb])(this);
      (*this->_vptr_Deserializer[3])(this);
      (*this->_vptr_Deserializer[7])(this);
      pmVar4 = ::std::
               map<unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>_>
               ::operator[](__return_storage_ptr__,&local_40);
      _Var2._M_head_impl =
           (pmVar4->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>
           )._M_t.
           super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
           super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl;
      (pmVar4->super_unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>).
      _M_t.super___uniq_ptr_impl<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>.
      _M_t.super__Tuple_impl<0UL,_duckdb::TableFilter_*,_std::default_delete<duckdb::TableFilter>_>.
      super__Head_base<0UL,_duckdb::TableFilter_*,_false>._M_head_impl = _Var5._M_head_impl;
      if (_Var2._M_head_impl != (TableFilter *)0x0) {
        (**(code **)((long)(_Var2._M_head_impl)->_vptr_TableFilter + 8))();
      }
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  (*this->_vptr_Deserializer[9])(this);
  return __return_storage_ptr__;
}

Assistant:

inline typename std::enable_if<is_map<T>::value, T>::type Read() {
		using KEY_TYPE = typename is_map<T>::KEY_TYPE;
		using VALUE_TYPE = typename is_map<T>::VALUE_TYPE;

		T map;
		auto size = OnListBegin();
		for (idx_t i = 0; i < size; i++) {
			OnObjectBegin();
			auto key = ReadProperty<KEY_TYPE>(0, "key");
			auto value = ReadProperty<VALUE_TYPE>(1, "value");
			OnObjectEnd();
			map[std::move(key)] = std::move(value);
		}
		OnListEnd();
		return map;
	}